

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O0

int xmlThrDefParserDebugEntities(int v)

{
  int iVar1;
  int ret;
  int v_local;
  
  xmlMutexLock(xmlThrDefMutex);
  iVar1 = xmlParserDebugEntitiesThrDef;
  xmlParserDebugEntitiesThrDef = v;
  xmlMutexUnlock(xmlThrDefMutex);
  return iVar1;
}

Assistant:

int xmlThrDefParserDebugEntities(int v) {
    int ret;
    xmlMutexLock(xmlThrDefMutex);
    ret = xmlParserDebugEntitiesThrDef;
    xmlParserDebugEntitiesThrDef = v;
    xmlMutexUnlock(xmlThrDefMutex);
    return ret;
}